

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int getBiomeCenters(Pos *pos,int *siz,int nmax,Generator *g,Range r,int match,int minsiz,int tol,
                   char *stop)

{
  int iVar1;
  Range r_00;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__s;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  int x;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int z;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 *puVar17;
  ulong uVar18;
  int iVar19;
  size_t __size;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  Generator *g_00;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Range tr;
  BiomeFilter bf;
  int local_1e4;
  Generator *local_1e0;
  anon_union_24592_3_e2189aaa_for_Generator_5 *local_1d8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  double local_1b8;
  double dStack_1b0;
  undefined1 local_1a8 [16];
  ulong local_190;
  int *local_188;
  ulong local_180;
  ulong local_178;
  int local_170;
  int local_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  undefined8 local_154;
  ulong local_148;
  ulong local_140;
  size_t local_138;
  undefined8 uStack_130;
  Pos *local_120;
  double local_118;
  double dStack_110;
  BiomeFilter local_108;
  
  if (minsiz < 2) {
    minsiz = 1;
  }
  local_178 = (ulong)(uint)r.sz;
  __size = (long)(r.sz * r.sx) << 2;
  local_1e4 = match;
  local_1c4 = minsiz;
  local_188 = siz;
  local_170 = nmax;
  local_120 = pos;
  __s = malloc(__size);
  local_138 = __size;
  memset(__s,0xff,__size);
  iVar3 = 1;
  if (1 < tol) {
    iVar3 = tol;
  }
  local_180 = (ulong)(uint)r.x;
  local_148 = (ulong)(uint)r.z;
  local_16c = r.y;
  iVar23 = g->mc;
  local_1bc = r.scale;
  local_1e0 = g;
  local_1c0 = iVar3;
  local_140 = (ulong)(uint)r.sx;
  if (iVar23 < 0x16) {
    iVar3 = (int)local_178;
    iVar19 = 8;
    if (0x1f < iVar3 + r.sx) {
      iVar19 = (int)(0x20 / (long)r.scale);
    }
    local_1d8 = (anon_union_24592_3_e2189aaa_for_Generator_5 *)(double)iVar19;
    dVar24 = floor((double)r.x / (double)local_1d8);
    dVar25 = floor((double)r.z / (double)local_1d8);
    dVar26 = ceil((double)((int)local_180 + r.sx) / (double)local_1d8);
    dVar27 = ceil((double)(r.z + iVar3) / (double)local_1d8);
    iVar22 = (int)dVar27 - (int)dVar25;
    local_190 = (ulong)(uint)(int)dVar25;
    setupBiomeFilter(&local_108,iVar23,0,&local_1e4,1,(int *)0x0,0,(int *)0x0,0);
    g_00 = local_1e0;
    local_168 = r.scale;
    iVar3 = 0;
    iStack_164 = 0;
    iStack_160 = 0;
    local_1b8 = (double)CONCAT44(local_1b8._4_4_,iVar19);
    local_154 = 0x100000000;
    iStack_15c = iVar19;
    local_158 = iVar19;
    local_1a8._0_8_ = allocCache(local_1e0,r);
    if (0 < iVar22) {
      iVar23 = (int)dVar26 - (int)dVar24;
      local_1d8 = (anon_union_24592_3_e2189aaa_for_Generator_5 *)((ulong)local_1b8 & 0xffffffff);
      lVar13 = (long)local_1d8 * 4;
      do {
        if (0 < iVar23) {
          iVar19 = (iVar3 + (int)local_190) * local_1b8._0_4_;
          iVar11 = 0;
          do {
            if ((stop != (char *)0x0) && (*stop != '\0')) break;
            iStack_164 = ((int)dVar24 + iVar11) * local_1b8._0_4_;
            r_00.x = iStack_164;
            r_00.scale = local_168;
            r_00.z = iVar19;
            r_00.sx = iStack_15c;
            r_00.sz = local_158;
            r_00.y = (undefined4)local_154;
            r_00.sy = local_154._4_4_;
            iStack_160 = iVar19;
            iVar2 = checkForBiomes(g_00,(int *)local_1a8._0_8_,r_00,0,g_00->seed,&local_108,stop);
            if ((iVar2 == 1) && (0 < local_1b8._0_4_)) {
              iVar2 = (iStack_160 - r.z) * r.sx;
              puVar17 = (undefined1 *)0x0;
              lVar6 = local_1a8._0_8_;
              do {
                iVar10 = (iStack_160 + (int)puVar17) - r.z;
                if ((-1 < iVar10) && (iVar10 < r.sz)) {
                  lVar8 = 0;
                  iVar10 = iStack_164 - r.x;
                  do {
                    if (iVar10 < r.sx && -1 < iVar10) {
                      *(undefined4 *)((long)__s + (ulong)(uint)(iVar2 + iVar10) * 4) =
                           *(undefined4 *)(lVar6 + lVar8);
                    }
                    lVar8 = lVar8 + 4;
                    iVar10 = iVar10 + 1;
                  } while (lVar13 - lVar8 != 0);
                }
                puVar17 = puVar17 + 1;
                lVar6 = lVar6 + (long)iStack_15c * 4;
                iVar2 = iVar2 + r.sx;
              } while ((anon_union_24592_3_e2189aaa_for_Generator_5 *)puVar17 != local_1d8);
            }
            iVar11 = iVar11 + 1;
            g_00 = local_1e0;
          } while (iVar11 != iVar23);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != iVar22);
    }
    free((void *)local_1a8._0_8_);
    iVar3 = local_1c0;
  }
  else {
    piVar5 = getBiomeParaLimits(iVar23,match);
    if (tol < 2) {
      dVar24 = (double)local_1c4;
      if (dVar24 < 0.0) {
        dVar24 = sqrt(dVar24);
      }
      else {
        dVar24 = SQRT(dVar24);
      }
      dVar24 = floor(dVar24 * 0.5);
      iVar3 = (int)(dVar24 + 1.0);
    }
    if (0 < r.sz) {
      local_1d8 = &local_1e0->field_5;
      iVar23 = 0;
      do {
        if (0 < r.sx) {
          iVar19 = 0;
          do {
            if ((stop != (char *)0x0) && (*stop != '\0')) break;
            lVar13 = 0;
            do {
              lVar6 = (long)*(int *)((long)&DAT_0012cb30 + lVar13);
              dVar24 = sampleDoublePerlin((DoublePerlinNoise *)((long)local_1d8 + lVar6 * 0x28),
                                          (double)((r.x + iVar19) * r.scale) * 0.25,0.0,
                                          (double)((r.z + iVar23) * r.scale) * 0.25);
              if (((int)(dVar24 * 10000.0) < piVar5[lVar6 * 2]) ||
                 (piVar5[lVar6 * 2 + 1] < (int)(dVar24 * 10000.0))) {
                *(undefined4 *)((long)__s + (long)(r.sx * iVar23 + iVar19) * 4) = 0xfffffffe;
                break;
              }
              lVar13 = lVar13 + 4;
            } while (lVar13 != 0x14);
            iVar19 = iVar19 + iVar3;
          } while (iVar19 < r.sx);
        }
        iVar23 = iVar23 + iVar3;
      } while (iVar23 < r.sz);
    }
    local_1e4 = -1;
    g_00 = local_1e0;
  }
  iVar23 = 0;
  applySeed(g_00,0,g_00->seed);
  iVar19 = local_1e4;
  if (0 < r.sz) {
    local_190 = local_138 * 3;
    local_118 = (double)local_1bc;
    iVar22 = 0;
    iVar23 = 0;
    dStack_110 = local_118;
    do {
      if (0 < r.sx) {
        iVar11 = 0;
        do {
          if ((stop != (char *)0x0) && (*stop != '\0')) break;
          if (*(int *)((long)__s + (long)(r.sx * iVar22 + iVar11) * 4) == iVar19) {
            piVar5 = (int *)malloc(local_190);
            *piVar5 = iVar11;
            piVar5[1] = iVar22;
            piVar5[2] = 0;
            lVar13 = 0;
            lVar6 = 0;
            uVar20 = 0;
            iVar2 = 0;
            uVar14 = local_140;
            uVar15 = local_178;
            uVar16 = local_180;
            uVar18 = local_148;
            do {
              if ((stop != (char *)0x0) && (*stop != '\0')) {
                free(piVar5);
                iVar2 = 0;
                goto LAB_00115680;
              }
              uVar7 = (ulong)uVar20;
              iVar10 = piVar5[uVar7 * 3];
              iVar1 = piVar5[uVar7 * 3 + 1];
              lVar8 = (long)(iVar1 * (int)uVar14 + iVar10);
              iVar4 = *(int *)((long)__s + lVar8 * 4);
              uVar21 = uVar20;
              if (iVar4 != 0x7fffffff) {
                iVar12 = piVar5[uVar7 * 3 + 2];
                *(undefined4 *)((long)__s + lVar8 * 4) = 0x7fffffff;
                x = iVar10 + (int)uVar16;
                z = iVar1 + (int)uVar18;
                if (0x15 < local_1e0->mc) {
                  local_1b8 = (double)CONCAT44(local_1b8._4_4_,z);
                  local_1d8 = (anon_union_24592_3_e2189aaa_for_Generator_5 *)
                              CONCAT44(local_1d8._4_4_,x);
                  local_1a8._8_4_ = (int)lVar6;
                  local_1a8._0_8_ = lVar13;
                  local_1a8._12_4_ = (int)((ulong)lVar6 >> 0x20);
                  iVar4 = getBiomeAt(local_1e0,local_1bc,x,local_16c,z);
                  uVar14 = local_140;
                  uVar15 = local_178;
                  uVar16 = local_180;
                  uVar18 = local_148;
                  x = (int)local_1d8;
                  z = local_1b8._0_4_;
                  lVar13 = local_1a8._0_8_;
                  lVar6 = local_1a8._8_8_;
                }
                if (iVar4 == match) {
                  lVar13 = lVar13 + z;
                  lVar6 = lVar6 + x;
                  iVar2 = iVar2 + 1;
                  iVar12 = 0;
                }
                else {
                  iVar12 = iVar12 + 1;
                  if (local_1c0 <= iVar12) goto LAB_001155b6;
                }
                local_108.tempsToFind._0_4_ = iVar10;
                local_108.tempsToFind._4_4_ = iVar1 + -1;
                local_108.otempToFind._0_4_ = iVar12;
                local_108.otempToFind._4_4_ = iVar10;
                local_108.majorToFind._0_4_ = iVar1 + 1;
                local_108.majorToFind._4_4_ = iVar12;
                local_108.edgesToFind._0_4_ = iVar10 + -1;
                local_108.edgesToFind._4_4_ = iVar1;
                local_108.raresToFind._0_4_ = iVar12;
                local_108.raresToFind._4_4_ = iVar10 + 1;
                local_108.raresToFindM._0_4_ = iVar1;
                local_108.raresToFindM._4_4_ = iVar12;
                lVar8 = 0;
                do {
                  iVar10 = *(int *)((long)&local_108.tempsToFind + lVar8);
                  if ((((-1 < iVar10) && (iVar10 < (int)uVar14)) &&
                      (iVar1 = *(int *)((long)&local_108.tempsToFind + lVar8 + 4), -1 < iVar1)) &&
                     ((iVar1 < (int)uVar15 &&
                      (*(int *)((long)__s + (ulong)(uint)(iVar1 * (int)uVar14 + iVar10) * 4) !=
                       0x7fffffff)))) {
                    lVar9 = (long)(int)uVar21;
                    uVar21 = uVar21 + 1;
                    piVar5[lVar9 * 3 + 2] = *(int *)((long)&local_108.otempToFind + lVar8);
                    *(undefined8 *)(piVar5 + lVar9 * 3) =
                         *(undefined8 *)((long)&local_108.tempsToFind + lVar8);
                  }
                  lVar8 = lVar8 + 0xc;
                } while (lVar8 != 0x30);
              }
LAB_001155b6:
              uVar20 = uVar21 - 1;
            } while (0 < (int)uVar21);
            local_1a8._8_4_ = (int)lVar6;
            local_1a8._0_8_ = lVar13;
            local_1a8._12_4_ = (int)((ulong)lVar6 >> 0x20);
            free(piVar5);
            if (iVar2 != 0) {
              auVar28._0_8_ = (double)(long)local_1a8._0_8_;
              auVar28._8_8_ = (double)(long)local_1a8._8_8_;
              auVar29._0_8_ = (double)iVar2;
              auVar29._8_8_ = auVar29._0_8_;
              auVar28 = divpd(auVar28,auVar29);
              local_1b8 = (auVar28._0_8_ + 0.5) * local_118;
              dStack_1b0 = (auVar28._8_8_ + 0.5) * dStack_110;
              local_1d8 = (anon_union_24592_3_e2189aaa_for_Generator_5 *)round(local_1b8);
              dVar24 = round(dStack_1b0);
              local_138 = CONCAT44((int)dVar24,(int)(double)local_1d8);
              uStack_130 = 0;
            }
LAB_00115680:
            iVar10 = 0;
            if (local_1c4 <= iVar2) {
              local_120[iVar23] = (Pos)(local_138 >> 0x20 | local_138 << 0x20);
              if (local_188 != (int *)0x0) {
                local_188[iVar23] = iVar2;
              }
              iVar23 = iVar23 + 1;
              iVar10 = 0x1d;
              if (iVar23 < local_170) {
                iVar10 = 0;
              }
            }
            if (iVar10 != 0) {
              if (iVar10 != 0x1d) {
                return iVar23;
              }
              goto LAB_00115725;
            }
          }
          iVar11 = iVar11 + iVar3;
        } while (iVar11 < r.sx);
      }
      iVar22 = iVar22 + iVar3;
    } while (iVar22 < r.sz);
  }
LAB_00115725:
  free(__s);
  return iVar23;
}

Assistant:

int getBiomeCenters(Pos *pos, int *siz, int nmax, Generator *g, Range r,
    int match, int minsiz, int tol, volatile char *stop)
{
    if (minsiz <= 0)
        minsiz = 1;
    int i, j, k, n = 0;
    int *ids = (int*) malloc(r.sx*r.sz * sizeof(int));
    memset(ids, -1, r.sx*r.sz * sizeof(int));
    if (tol <= 0)
        tol = 1;
    int step = tol;
    struct locate_info_t info;
    info.g = g;
    info.ids = ids;
    info.r = r;
    info.stop = stop;
    info.match = match;
    info.tol = tol;

    if (g->mc >= MC_1_18)
    {
        const int *lim = getBiomeParaLimits(g->mc, match);

        int para[] = {
            NP_TEMPERATURE,
            NP_HUMIDITY,
            NP_EROSION,
            NP_CONTINENTALNESS,
            NP_WEIRDNESS,
        };
        int npara = sizeof(para) / sizeof(para[0]);
        if (tol == 1)
            step = 1 + floor(sqrt(minsiz) * 0.5);

        for (j = 0; j < r.sz; j += step)
        {
            for (i = 0; i < r.sx; i += step)
            {
                if (stop && *stop)
                    break;
                for (k = 0; k < npara; k++)
                {
                    const int *plim = lim + 2*para[k];
                    if (plim[0] == INT_MIN && plim[1] == INT_MAX)
                        continue;
                    DoublePerlinNoise *dpn = &g->bn.climate[para[k]];
                    double px = (r.x+i) * r.scale / 4.0;
                    double pz = (r.z+j) * r.scale / 4.0;
                    int p = 10000 * sampleDoublePerlin(dpn, px, 0, pz);
                    if (p < plim[0] || p > plim[1])
                    {
                        ids[j*r.sx + i] = -2;
                        break;
                    }
                }
            }
        }
        match = -1; // id entries that are still -1 are our candidates
    }
    else // 1.17-
    {
        int ts = 32 / r.scale;
        if (r.sx + r.sz < 32)
            ts = 8;

        int tx = (int) floor(r.x / (double)ts);
        int tz = (int) floor(r.z / (double)ts);
        int tw = (int) ceil((r.x+r.sx) / (double)ts) - tx;
        int th = (int) ceil((r.z+r.sz) / (double)ts) - tz;
        int ti, tj;

        BiomeFilter bf;
        setupBiomeFilter(&bf, g->mc, 0, &match, 1, 0, 0, 0, 0);
        //applySeed(g, 0, g->seed);

        Range tr = { r.scale, 0, 0, ts, ts, 0, 1 };
        int *cache = allocCache(g, r);

        for (tj = 0; tj < th; tj++)
        {
            for (ti = 0; ti < tw; ti++)
            {
                if (stop && *stop)
                    break;
                tr.x = (tx+ti) * ts;
                tr.z = (tz+tj) * ts;
                if (checkForBiomes(g, cache, tr, DIM_OVERWORLD, g->seed,
                    &bf, stop) != 1)
                {
                    continue;
                }
                for (j = 0; j < ts; j++)
                {
                    int jj = tr.z + j - r.z;
                    if (jj < 0 || jj >= r.sz)
                        continue;
                    for (i = 0; i < ts; i++)
                    {
                        int ii = tr.x + i - r.x;
                        if (ii < 0 || ii >= r.sx)
                            continue;
                        ids[jj*r.sx + ii] = cache[j*tr.sx + i];
                    }
                }
            }
        }
        free(cache);
    }

    applySeed(g, DIM_OVERWORLD, g->seed);
    for (j = 0; j < r.sz; j += step)
    {
        for (i = 0; i < r.sx; i += step)
        {
            if (stop && *stop)
                break;
            if (ids[j*r.sx + i] != match)
                continue;
            Pos center;
            int area = floodFillGen(&info, i, j, &center);
            if (area >= minsiz)
            {
                pos[n] = center;
                if (siz) siz[n] = area;
                if (++n >= nmax)
                    goto L_end;
            }
        }
    }

L_end:
    free(ids);

    return n;
}